

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O3

int is_pure(boolean talk)

{
  aligntyp alignment;
  char cVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  
  alignment = u.ualignbase[1];
  if ((talk != '\0') && (flags.debug != '\0')) {
    if (u.ualign.type == u.ualignbase[1]) {
      if (u.ualignbase[0] == u.ualignbase[1]) {
        if (moves < 0x898) {
          uVar3 = (moves & 0xffff) / 200 + 10;
          if ((int)uVar3 <= u.ualign.record) goto LAB_0022b26d;
          uVar6 = (ulong)uVar3;
        }
        else {
          uVar6 = 0x14;
          if (0x13 < u.ualign.record) goto LAB_0022b29b;
        }
        pline("You are currently %d and require %d.",(ulong)(uint)u.ualign.record,uVar6);
        cVar1 = yn_function("adjust?","yn",'y');
        if ((cVar1 == 'y') && (u.ualign.record = 0x14, moves < 0x898)) {
          u.ualign.record = (moves & 0xffff) / 200 + 10;
        }
      }
      else {
        pline("You have converted.");
      }
    }
    else {
      pcVar4 = align_str(u.ualign.type);
      pcVar5 = align_str(alignment);
      pline("You are currently %s instead of %s.",pcVar4,pcVar5);
    }
  }
LAB_0022b26d:
  uVar6 = 0x14;
  if (moves < 0x898) {
    uVar6 = (ulong)((moves & 0xffff) / 200 + 10);
  }
LAB_0022b29b:
  iVar2 = 1;
  if (u.ualignbase[0] != alignment || u.ualign.type != alignment) {
    iVar2 = -(uint)(u.ualignbase[0] != alignment);
  }
  if ((long)u.ualign.record < (long)uVar6) {
    iVar2 = -(uint)(u.ualignbase[0] != alignment);
  }
  return iVar2;
}

Assistant:

static int is_pure(boolean talk)
{
    int purity;
    aligntyp original_alignment = u.ualignbase[A_ORIGINAL];

    if (wizard && talk) {
	if (u.ualign.type != original_alignment) {
	    pline("You are currently %s instead of %s.",
		align_str(u.ualign.type), align_str(original_alignment));
	} else if (u.ualignbase[A_CURRENT] != original_alignment) {
	    pline("You have converted.");
	} else if (u.ualign.record < MIN_QUEST_ALIGN) {
	    pline("You are currently %d and require %d.",
		u.ualign.record, MIN_QUEST_ALIGN);
	    if (yn_function("adjust?", ynchars, 'y') == 'y')
		u.ualign.record = MIN_QUEST_ALIGN;
	}
    }
    
    purity = (u.ualign.record >= MIN_QUEST_ALIGN &&
	      u.ualign.type == original_alignment &&
	      u.ualignbase[A_CURRENT] == original_alignment) ?  1 :
	     (u.ualignbase[A_CURRENT] != original_alignment) ? -1 : 0;
    return purity;
}